

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int equal_email(uchar *a,size_t a_len,uchar *b,size_t b_len,uint unused_flags)

{
  int iVar1;
  size_t local_40;
  size_t i;
  uint unused_flags_local;
  size_t b_len_local;
  uchar *b_local;
  size_t a_len_local;
  uchar *a_local;
  
  local_40 = a_len;
  if (a_len == b_len) {
    do {
      if (local_40 == 0) goto LAB_00771a2b;
      local_40 = local_40 - 1;
    } while ((a[local_40] != '@') && (b[local_40] != '@'));
    iVar1 = equal_nocase(a + local_40,a_len - local_40,b + local_40,a_len - local_40,0);
    if (iVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
LAB_00771a2b:
      if (local_40 == 0) {
        local_40 = a_len;
      }
      a_local._4_4_ = equal_case(a,local_40,b,local_40,0);
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int equal_email(const unsigned char *a, size_t a_len,
                       const unsigned char *b, size_t b_len,
                       unsigned int unused_flags) {
  size_t i = a_len;
  if (a_len != b_len) {
    return 0;
  }
  // We search backwards for the '@' character, so that we do not have to
  // deal with quoted local-parts.  The domain part is compared in a
  // case-insensitive manner.
  while (i > 0) {
    --i;
    if (a[i] == '@' || b[i] == '@') {
      if (!equal_nocase(a + i, a_len - i, b + i, a_len - i, 0)) {
        return 0;
      }
      break;
    }
  }
  if (i == 0) {
    i = a_len;
  }
  return equal_case(a, i, b, i, 0);
}